

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

bool QPDF::test_json_validators(void)

{
  byte bVar1;
  bool bVar2;
  allocator<char> local_4d1;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  allocator<char> local_459;
  string local_458;
  allocator<char> local_431;
  string local_430;
  allocator<char> local_409;
  string local_408;
  allocator<char> local_3e1;
  string local_3e0;
  allocator<char> local_3b9;
  string local_3b8;
  allocator<char> local_391;
  string local_390;
  allocator<char> local_369;
  string local_368;
  allocator<char> local_341;
  string local_340;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  allocator<char> local_2c9;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  allocator<char> local_229;
  string local_228;
  undefined1 local_208 [8];
  string str;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  int local_20;
  int local_1c;
  int gen;
  int obj;
  anon_class_8_1_65cfa1ae check_fn;
  bool passed;
  
  check_fn.passed._7_1_ = 1;
  _gen = (bool *)((long)&check_fn.passed + 7);
  local_1c = 0;
  local_20 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  bVar2 = is_indirect_object(&local_40,&local_1c,&local_20);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"!is_indirect_object(\"\", obj, gen)",
             (bool)(~bVar2 & 1));
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"12",&local_79);
  bVar2 = is_indirect_object(&local_78,&local_1c,&local_20);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"!is_indirect_object(\"12\", obj, gen)",
             (bool)(~bVar2 & 1));
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"x12 0 R",&local_a1);
  bVar2 = is_indirect_object(&local_a0,&local_1c,&local_20);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"!is_indirect_object(\"x12 0 R\", obj, gen)",
             (bool)(~bVar2 & 1));
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"12 0 Rx",&local_c9);
  bVar2 = is_indirect_object(&local_c8,&local_1c,&local_20);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"!is_indirect_object(\"12 0 Rx\", obj, gen)",
             (bool)(~bVar2 & 1));
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"12 0R",&local_f1);
  bVar2 = is_indirect_object(&local_f0,&local_1c,&local_20);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"!is_indirect_object(\"12 0R\", obj, gen)",
             (bool)(~bVar2 & 1));
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"52 1 R",&local_119);
  bVar2 = is_indirect_object(&local_118,&local_1c,&local_20);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"is_indirect_object(\"52 1 R\", obj, gen)",bVar2);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"obj == 52",local_1c == 0x34);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"gen == 1",local_20 == 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"53  20  R",&local_141);
  bVar2 = is_indirect_object(&local_140,&local_1c,&local_20);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"is_indirect_object(\"53  20  R\", obj, gen)",bVar2);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"obj == 53",local_1c == 0x35);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"gen == 20",local_20 == 0x14);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"",&local_169);
  bVar2 = is_obj_key(&local_168,&local_1c,&local_20);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"!is_obj_key(\"\", obj, gen)",(bool)(~bVar2 & 1));
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"obj:x",&local_191);
  bVar2 = is_obj_key(&local_190,&local_1c,&local_20);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"!is_obj_key(\"obj:x\", obj, gen)",(bool)(~bVar2 & 1));
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"obj:x",&local_1b9);
  bVar2 = is_obj_key(&local_1b8,&local_1c,&local_20);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"!is_obj_key(\"obj:x\", obj, gen)",(bool)(~bVar2 & 1));
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,"obj:12 13 R",(allocator<char> *)(str.field_2._M_local_buf + 0xf))
  ;
  bVar2 = is_obj_key(&local_1e0,&local_1c,&local_20);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"is_obj_key(\"obj:12 13 R\", obj, gen)",bVar2);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)(str.field_2._M_local_buf + 0xf));
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"obj == 12",local_1c == 0xc);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"gen == 13",local_20 == 0xd);
  std::__cxx11::string::string((string *)local_208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"",&local_229);
  bVar2 = is_unicode_string(&local_228,(string *)local_208);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"!is_unicode_string(\"\", str)",(bool)(~bVar2 & 1));
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator(&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"xyz",&local_251);
  bVar2 = is_unicode_string(&local_250,(string *)local_208);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"!is_unicode_string(\"xyz\", str)",(bool)(~bVar2 & 1));
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"x:",&local_279);
  bVar2 = is_unicode_string(&local_278,(string *)local_208);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"!is_unicode_string(\"x:\", str)",(bool)(~bVar2 & 1));
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"u:potato",&local_2a1);
  bVar2 = is_unicode_string(&local_2a0,(string *)local_208);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"is_unicode_string(\"u:potato\", str)",bVar2);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_208,"potato");
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"str == \"potato\"",bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"u:",&local_2c9);
  bVar2 = is_unicode_string(&local_2c8,(string *)local_208);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"is_unicode_string(\"u:\", str)",bVar2);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_208,"");
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"str == \"\"",bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"",&local_2f1);
  bVar2 = is_binary_string(&local_2f0,(string *)local_208);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"!is_binary_string(\"\", str)",(bool)(~bVar2 & 1));
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator(&local_2f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"x:",&local_319);
  bVar2 = is_binary_string(&local_318,(string *)local_208);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"!is_binary_string(\"x:\", str)",(bool)(~bVar2 & 1));
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator(&local_319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"b:1",&local_341);
  bVar2 = is_binary_string(&local_340,(string *)local_208);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"!is_binary_string(\"b:1\", str)",(bool)(~bVar2 & 1));
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator(&local_341);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"b:123",&local_369);
  bVar2 = is_binary_string(&local_368,(string *)local_208);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"!is_binary_string(\"b:123\", str)",(bool)(~bVar2 & 1))
  ;
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_390,"b:gh",&local_391);
  bVar2 = is_binary_string(&local_390,(string *)local_208);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"!is_binary_string(\"b:gh\", str)",(bool)(~bVar2 & 1));
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator(&local_391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,"b:",&local_3b9);
  bVar2 = is_binary_string(&local_3b8,(string *)local_208);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"is_binary_string(\"b:\", str)",bVar2);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"b:12",&local_3e1);
  bVar2 = is_binary_string(&local_3e0,(string *)local_208);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"is_binary_string(\"b:12\", str)",bVar2);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"b:123aBC",&local_409);
  bVar2 = is_binary_string(&local_408,(string *)local_208);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"is_binary_string(\"b:123aBC\", str)",bVar2);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"",&local_431);
  bVar2 = is_name(&local_430);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"!is_name(\"\")",(bool)(~bVar2 & 1));
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator(&local_431);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,"/",&local_459);
  bVar2 = is_name(&local_458);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"!is_name(\"/\")",(bool)(~bVar2 & 1));
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator(&local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"xyz",&local_481);
  bVar2 = is_name(&local_480);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"!is_name(\"xyz\")",(bool)(~bVar2 & 1));
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator(&local_481);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"/Potato",&local_4a9);
  bVar2 = is_name(&local_4a8);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"is_name(\"/Potato\")",bVar2);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator(&local_4a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d0,"/Potato Salad",&local_4d1);
  bVar2 = is_name(&local_4d0);
  test_json_validators::anon_class_8_1_65cfa1ae::operator()
            ((anon_class_8_1_65cfa1ae *)&gen,"is_name(\"/Potato Salad\")",bVar2);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator(&local_4d1);
  bVar1 = check_fn.passed._7_1_;
  std::__cxx11::string::~string((string *)local_208);
  return (bool)(bVar1 & 1);
}

Assistant:

bool
QPDF::test_json_validators()
{
    bool passed = true;
    auto check_fn = [&passed](char const* msg, bool expr) {
        if (!expr) {
            passed = false;
            std::cerr << msg << std::endl;
        }
    };
#define check(expr) check_fn(#expr, expr)

    int obj = 0;
    int gen = 0;
    check(!is_indirect_object("", obj, gen));
    check(!is_indirect_object("12", obj, gen));
    check(!is_indirect_object("x12 0 R", obj, gen));
    check(!is_indirect_object("12 0 Rx", obj, gen));
    check(!is_indirect_object("12 0R", obj, gen));
    check(is_indirect_object("52 1 R", obj, gen));
    check(obj == 52);
    check(gen == 1);
    check(is_indirect_object("53  20  R", obj, gen));
    check(obj == 53);
    check(gen == 20);
    check(!is_obj_key("", obj, gen));
    check(!is_obj_key("obj:x", obj, gen));
    check(!is_obj_key("obj:x", obj, gen));
    check(is_obj_key("obj:12 13 R", obj, gen));
    check(obj == 12);
    check(gen == 13);
    std::string str;
    check(!is_unicode_string("", str));
    check(!is_unicode_string("xyz", str));
    check(!is_unicode_string("x:", str));
    check(is_unicode_string("u:potato", str));
    check(str == "potato");
    check(is_unicode_string("u:", str));
    check(str == "");
    check(!is_binary_string("", str));
    check(!is_binary_string("x:", str));
    check(!is_binary_string("b:1", str));
    check(!is_binary_string("b:123", str));
    check(!is_binary_string("b:gh", str));
    check(is_binary_string("b:", str));
    check(is_binary_string("b:12", str));
    check(is_binary_string("b:123aBC", str));
    check(!is_name(""));
    check(!is_name("/"));
    check(!is_name("xyz"));
    check(is_name("/Potato"));
    check(is_name("/Potato Salad"));

    return passed;
#undef check_arg
}